

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

MemTxResult
memory_region_dispatch_read_mipsel
          (uc_struct_conflict5 *uc,MemoryRegion *mr,hwaddr addr,uint64_t *pval,MemOp_conflict2 op,
          MemTxAttrs attrs)

{
  int iVar1;
  uint access_size_max;
  MemoryRegionOps *pMVar2;
  _Bool _Var3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  hwaddr hVar7;
  uint uVar8;
  uint size;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  MemTxResult local_60;
  
  size = 1 << ((byte)op & 3);
  _Var3 = memory_region_access_valid_mipsel(uc,mr,addr,size,false,attrs);
  *pval = 0;
  local_60 = 2;
  if (_Var3) {
    pMVar2 = mr->ops;
    uVar9 = (pMVar2->impl).min_access_size;
    access_size_max = (pMVar2->impl).max_access_size;
    if (pMVar2->read == (_func_uint64_t_uc_struct_ptr_void_ptr_hwaddr_uint_conflict15 *)0x0) {
      local_60 = access_with_adjusted_size
                           (uc,addr,pval,size,uVar9,access_size_max,
                            memory_region_read_with_attrs_accessor,mr,attrs);
    }
    else {
      uVar8 = 4;
      if (access_size_max != 0) {
        uVar8 = access_size_max;
      }
      if (size <= uVar8) {
        uVar8 = size;
      }
      if (uVar8 < uVar9) {
        uVar8 = uVar9;
      }
      uVar8 = uVar8 + (uVar8 == 0);
      iVar1 = uVar8 * 8;
      uVar11 = 0xffffffffffffffff >> (-(char)iVar1 & 0x3fU);
      if (pMVar2->endianness == DEVICE_BIG_ENDIAN) {
        iVar12 = size * -8;
        iVar13 = size * 8 + uVar8 * -8;
        local_60 = 0;
        uVar10 = 0;
        do {
          iVar12 = iVar1 + iVar12;
          hVar7 = uVar10 + addr;
          uVar9 = (int)uVar10 + uVar8;
          uVar10 = (ulong)uVar9;
          uVar4 = (*mr->ops->read)((uc_struct_conflict15 *)uc,mr->opaque,hVar7,uVar8);
          uVar5 = uVar4 & uVar11;
          uVar6 = uVar5 << ((byte)iVar13 & 0x3f);
          if (iVar13 < 0) {
            uVar6 = uVar5 >> ((byte)iVar12 & 0x3f);
          }
          *pval = *pval | uVar6;
          iVar13 = iVar13 + uVar8 * -8;
        } while (uVar9 < size);
      }
      else {
        local_60 = 0;
        iVar12 = 0;
        uVar10 = 0;
        do {
          uVar4 = (*mr->ops->read)((uc_struct_conflict15 *)uc,mr->opaque,uVar10 + addr,uVar8);
          *pval = *pval | (uVar4 & uVar11) << ((byte)iVar12 & 0x3f);
          uVar9 = (int)uVar10 + uVar8;
          uVar10 = (ulong)uVar9;
          iVar12 = iVar12 + iVar1;
        } while (uVar9 < size);
      }
    }
    adjust_endianness((MemoryRegion *)(ulong)mr->ops->endianness,pval,op);
  }
  return local_60;
}

Assistant:

MemTxResult memory_region_dispatch_read(struct uc_struct *uc, MemoryRegion *mr,
                                        hwaddr addr,
                                        uint64_t *pval,
                                        MemOp op,
                                        MemTxAttrs attrs)
{
    unsigned size = memop_size(op);
    MemTxResult r;

    if (!memory_region_access_valid(uc, mr, addr, size, false, attrs)) {
        *pval = unassigned_mem_read(mr, addr, size);
        return MEMTX_DECODE_ERROR;
    }

    r = memory_region_dispatch_read1(uc, mr, addr, pval, size, attrs);
    adjust_endianness(mr, pval, op);
    return r;
}